

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O3

void dmrC_init_preprocessor_state(dmr_C *C)

{
  char **ppcVar1;
  
  if (C->includepath[0] == (char *)0x0) {
    C->includepath[0] = "";
    ppcVar1 = C->includepath + 1;
    C->includepath[1] = "/usr/include";
    C->includepath[2] = "/usr/local/include";
    C->includepath[3] = (char *)0x0;
    C->quote_includepath = C->includepath;
    C->angle_includepath = ppcVar1;
    C->isys_includepath = ppcVar1;
    C->sys_includepath = ppcVar1;
    C->dirafter_includepath = C->includepath + 3;
    return;
  }
  __assert_fail("C->includepath[0] == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/pre-process.c"
                ,0x811,"void dmrC_init_preprocessor_state(struct dmr_C *)");
}

Assistant:

void dmrC_init_preprocessor_state(struct dmr_C *C) {
	assert(C->includepath[0] == NULL);
	C->includepath[0] = "";
	C->includepath[1] = "/usr/include";
	C->includepath[2] = "/usr/local/include";
	C->includepath[3] = NULL;

	C->quote_includepath = C->includepath;
	C->angle_includepath = C->includepath + 1;
	C->isys_includepath = C->includepath + 1;
	C->sys_includepath = C->includepath + 1;
	C->dirafter_includepath = C->includepath + 3;
}